

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

ostream * s2pred::operator<<(ostream *os,Excluded excluded)

{
  Excluded excluded_local;
  ostream *os_local;
  
  switch(excluded) {
  case FIRST:
    os_local = std::operator<<(os,"FIRST");
    break;
  case SECOND:
    os_local = std::operator<<(os,"SECOND");
    break;
  case NEITHER:
    os_local = std::operator<<(os,"NEITHER");
    break;
  case UNCERTAIN:
    os_local = std::operator<<(os,"UNCERTAIN");
    break;
  default:
    os_local = std::operator<<(os,"Unknown enum value");
  }
  return os_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Excluded excluded) {
  switch (excluded) {
    case Excluded::FIRST: return os << "FIRST";
    case Excluded::SECOND: return os << "SECOND";
    case Excluded::NEITHER: return os << "NEITHER";
    case Excluded::UNCERTAIN: return os << "UNCERTAIN";
    default: return os << "Unknown enum value";
  }
}